

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O0

ssize_t coda_base58_decode_alloc(char *in,size_t inlen,char **out)

{
  void *pvVar1;
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  ssize_t ret;
  size_t needlen;
  size_t b256len;
  size_t zeroes;
  char *local_30;
  char *out_00;
  ssize_t local_8;
  
  out_00 = (char *)0x0;
  local_30 = in_RSI;
  while( true ) {
    bVar2 = false;
    if (local_30 != (char *)0x0) {
      bVar2 = out_00[in_RDI] == '1';
    }
    if (!bVar2) break;
    out_00 = out_00 + 1;
    local_30 = local_30 + -1;
  }
  pvVar1 = malloc((size_t)(out_00 + (ulong)((long)local_30 * 0x2dd) / 1000 + 1));
  *in_RDX = (long)pvVar1;
  if (*in_RDX == 0) {
    local_8 = 1;
  }
  else {
    local_8 = coda_base58_decode(in_RSI,(size_t)in_RDX,out_00);
    if (local_8 < 0) {
      free((void *)*in_RDX);
      *in_RDX = 0;
    }
  }
  return local_8;
}

Assistant:

ssize_t coda_base58_decode_alloc (const char *in, size_t inlen, char **out)
{
    size_t zeroes = 0;
    size_t b256len = inlen;

    while (b256len && in[zeroes] == '1')
    {
        zeroes++;
        b256len--;
    }

    size_t needlen = zeroes + b256len * 733 / 1000 + 1;
    *out = malloc (needlen);
    if (!*out)
        return true;

    ssize_t ret = coda_base58_decode (in, inlen, *out);
    if (ret < 0)
    {
        free (*out);
        *out = NULL;
        return ret;
    }

    return ret;
}